

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O0

char queryparse::unescape_char(char escaped)

{
  runtime_error *this;
  char in_DIL;
  char local_1;
  
  if (in_DIL == '\"') {
    local_1 = '\"';
  }
  else if (in_DIL == '\\') {
    local_1 = '\\';
  }
  else if (in_DIL == 'b') {
    local_1 = '\b';
  }
  else if (in_DIL == 'f') {
    local_1 = '\f';
  }
  else if (in_DIL == 'n') {
    local_1 = '\n';
  }
  else if (in_DIL == 'r') {
    local_1 = '\r';
  }
  else {
    if (in_DIL != 't') {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unexpected escaped char");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = '\t';
  }
  return local_1;
}

Assistant:

constexpr char unescape_char(char escaped) {
    switch (escaped) {
        case '"':
            return '\"';
        case '\\':
            return '\\';
        case 'b':
            return '\b';
        case 'f':
            return '\f';
        case 'n':
            return '\n';
        case 'r':
            return '\r';
        case 't':
            return '\t';
        default:
            throw std::runtime_error("unexpected escaped char");
    }
}